

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.h
# Opt level: O3

void je_smallocx_dc3cde52e6351a40d5b63dcec472d0936c15d1bb_cold_4(void)

{
  long lVar1;
  ulong uVar2;
  ulong *in_RSI;
  long in_RDI;
  
  uVar2 = in_RDI * 2 - 1;
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar2 = 0xf;
  if (6 < (uint)lVar1) {
    uVar2 = ~(-1L << ((char)lVar1 - 3U & 0x3f));
  }
  *in_RSI = ~uVar2 & in_RDI + uVar2;
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE size_t
sz_s2u_compute(size_t size) {
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		return 0;
	}

	if (size == 0) {
		size++;
	}
#if (SC_NTINY > 0)
	if (size <= (ZU(1) << SC_LG_TINY_MAXCLASS)) {
		size_t lg_tmin = SC_LG_TINY_MAXCLASS - SC_NTINY + 1;
		size_t lg_ceil = lg_floor(pow2_ceil_zu(size));
		return (lg_ceil < lg_tmin ? (ZU(1) << lg_tmin) :
		    (ZU(1) << lg_ceil));
	}
#endif
	{
		size_t x = lg_floor((size<<1)-1);
		size_t lg_delta = (x < SC_LG_NGROUP + LG_QUANTUM + 1)
		    ?  LG_QUANTUM : x - SC_LG_NGROUP - 1;
		size_t delta = ZU(1) << lg_delta;
		size_t delta_mask = delta - 1;
		size_t usize = (size + delta_mask) & ~delta_mask;
		return usize;
	}
}